

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptTextureBufferType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  TTypeList *userDef;
  char *syntax;
  pool_allocator<char> local_190;
  TString local_188;
  TType templateType;
  TType blockType;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokTextureBuffer);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      TType::TType(&templateType,EbtVoid,EvqTemporary,1,0,0,false);
      bVar1 = acceptType(this,&templateType);
      if (bVar1) {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) {
          templateType.qualifier._8_8_ =
               templateType.qualifier._8_8_ & 0xffff7fffffffff80 | 0x800000000006;
          userDef = TType::getWritableStruct(&templateType);
          local_190.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_188,"",&local_190);
          TType::TType(&blockType,userDef,&local_188,&templateType.qualifier);
          blockType.qualifier._8_8_ =
               blockType.qualifier._8_8_ & 0xffff7fffffffff80 | 0x800000000006;
          TType::shallowCopy(type,&blockType);
          return true;
        }
        syntax = "right angle bracket";
      }
      else {
        syntax = "type";
      }
    }
    else {
      syntax = "left angle bracket";
    }
    expected(this,syntax);
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptTextureBufferType(TType& type)
{
    if (! acceptTokenClass(EHTokTextureBuffer))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        expected("left angle bracket");
        return false;
    }
    
    TType templateType;
    if (! acceptType(templateType)) {
        expected("type");
        return false;
    }

    if (! acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    templateType.getQualifier().storage = EvqBuffer;
    templateType.getQualifier().readonly = true;

    TType blockType(templateType.getWritableStruct(), "", templateType.getQualifier());

    blockType.getQualifier().storage = EvqBuffer;
    blockType.getQualifier().readonly = true;

    type.shallowCopy(blockType);

    return true;
}